

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise_x86_avx::forward
          (Eltwise_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  undefined1 auVar24 [24];
  ulong uVar25;
  size_type sVar26;
  float *pfVar27;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  bool bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  __m128 _p1_15;
  __m128 _p_15;
  __m256 _p1_14;
  __m256 _p_14;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob2_3;
  size_t b_3;
  __m128 _p1_13;
  __m128 _p_13;
  __m256 _p1_12;
  __m256 _p_12;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_3;
  __m128 _p_11;
  __m128 _p1_11;
  __m128 _coeff;
  __m256 _p1_10;
  __m256 _p_10;
  __m256 _coeff_avx;
  int i_5;
  float coeff;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  Mat *bottom_blob2_2;
  size_t b_2;
  __m128 _p1_9;
  __m128 _p_9;
  __m128 _coeff1;
  __m128 _coeff0;
  __m256 _p1_8;
  __m256 _p_8;
  __m256 _coeff1_avx;
  __m256 _coeff0_avx;
  int i_4;
  float coeff1;
  float coeff0;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  Mat *bottom_blob1_2;
  __m128 _p1_7;
  __m128 _p_7;
  __m256 _p1_6;
  __m256 _p_6;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob2_1;
  size_t b_1;
  __m128 _p1_5;
  __m128 _p_5;
  __m256 _p1_4;
  __m256 _p_4;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_1;
  __m128 _p1_3;
  __m128 _p_3;
  __m256 _p1_2;
  __m256 _p_2;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob2;
  size_t b;
  __m128 _p1_1;
  __m128 _p_1;
  __m256 _p1;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *m_18;
  Mat *m_16;
  Mat *m_15;
  Mat *m_13;
  Mat *m_11;
  Mat *m_10;
  Mat *m_8;
  Mat *m_6;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_19;
  Mat *m_17;
  Mat *m_14;
  Mat *m_12;
  Mat *m_9;
  Mat *m_7;
  Mat *m_4;
  Mat *m_2;
  Allocator *in_stack_ffffffffffffd6f8;
  Mat *in_stack_ffffffffffffd700;
  Mat *in_stack_ffffffffffffd708;
  undefined8 local_2590;
  undefined8 uStack_2588;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  int local_253c;
  undefined8 local_2538;
  undefined8 local_2530;
  undefined8 local_2528;
  undefined4 local_2520;
  Allocator *local_2518;
  undefined4 local_2510;
  undefined4 local_250c;
  undefined4 local_2508;
  undefined4 local_2504;
  undefined4 local_2500;
  undefined8 local_24f8;
  undefined1 (*local_24f0) [32];
  undefined8 local_24e8;
  undefined8 local_24e0;
  undefined8 local_24d8;
  undefined4 local_24d0;
  Allocator *local_24c8;
  undefined4 local_24c0;
  undefined4 local_24bc;
  undefined4 local_24b8;
  undefined4 local_24b4;
  undefined4 local_24b0;
  undefined8 local_24a8;
  undefined1 (*local_24a0) [32];
  int local_2494;
  const_reference local_2490;
  ulong local_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined1 local_2470 [16];
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined1 local_2440 [32];
  int local_2414;
  undefined8 local_2410;
  undefined8 local_2408;
  undefined8 local_2400;
  undefined4 local_23f8;
  Allocator *local_23f0;
  undefined4 local_23e8;
  undefined4 local_23e4;
  undefined4 local_23e0;
  undefined4 local_23dc;
  undefined4 local_23d8;
  undefined8 local_23d0;
  undefined1 (*local_23c8) [32];
  undefined8 local_23c0;
  undefined8 local_23b8;
  undefined8 local_23b0;
  undefined4 local_23a8;
  Allocator *local_23a0;
  undefined4 local_2398;
  undefined4 local_2394;
  undefined4 local_2390;
  undefined4 local_238c;
  undefined4 local_2388;
  undefined8 local_2380;
  undefined1 (*local_2378) [32];
  undefined8 local_2370;
  undefined8 local_2368;
  undefined8 local_2360;
  undefined4 local_2358;
  Allocator *local_2350;
  undefined4 local_2348;
  undefined4 local_2344;
  undefined4 local_2340;
  undefined4 local_233c;
  undefined4 local_2338;
  undefined8 local_2330;
  undefined1 (*local_2328) [32];
  int local_231c;
  const_reference local_2318;
  undefined8 local_2310;
  undefined8 uStack_2308;
  float local_2300;
  float fStack_22fc;
  float fStack_22f8;
  float fStack_22f4;
  undefined1 local_22f0 [16];
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  int local_2280;
  float local_227c;
  undefined8 local_2278;
  undefined8 local_2270;
  undefined8 local_2268;
  undefined4 local_2260;
  Allocator *local_2258;
  undefined4 local_2250;
  undefined4 local_224c;
  undefined4 local_2248;
  undefined4 local_2244;
  undefined4 local_2240;
  undefined8 local_2238;
  undefined1 (*local_2230) [16];
  undefined8 local_2228;
  undefined8 local_2220;
  undefined8 local_2218;
  undefined4 local_2210;
  Allocator *local_2208;
  undefined4 local_2200;
  undefined4 local_21fc;
  undefined4 local_21f8;
  undefined4 local_21f4;
  undefined4 local_21f0;
  undefined8 local_21e8;
  float *local_21e0;
  int local_21d4;
  const_reference local_21d0;
  ulong local_21c8;
  float local_21c0;
  float fStack_21bc;
  float fStack_21b8;
  float fStack_21b4;
  undefined8 local_21b0;
  undefined8 uStack_21a8;
  undefined1 local_21a0 [16];
  undefined8 local_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  int local_20ec;
  float local_20e8;
  float local_20e4;
  undefined8 local_20e0;
  undefined8 local_20d8;
  undefined8 local_20d0;
  undefined4 local_20c8;
  Allocator *local_20c0;
  undefined4 local_20b8;
  undefined4 local_20b4;
  undefined4 local_20b0;
  undefined4 local_20ac;
  undefined4 local_20a8;
  undefined8 local_20a0;
  undefined1 (*local_2098) [16];
  undefined8 local_2090;
  undefined8 local_2088;
  undefined8 local_2080;
  undefined4 local_2078;
  Allocator *local_2070;
  undefined4 local_2068;
  undefined4 local_2064;
  undefined4 local_2060;
  undefined4 local_205c;
  undefined4 local_2058;
  undefined8 local_2050;
  float *local_2048;
  undefined8 local_2040;
  undefined8 local_2038;
  undefined8 local_2030;
  undefined4 local_2028;
  Allocator *local_2020;
  undefined4 local_2018;
  undefined4 local_2014;
  undefined4 local_2010;
  undefined4 local_200c;
  undefined4 local_2008;
  undefined8 local_2000;
  float *local_1ff8;
  int local_1fec;
  const_reference local_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  float local_1fd0;
  float fStack_1fcc;
  float fStack_1fc8;
  float fStack_1fc4;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  float local_1fa0;
  float fStack_1f9c;
  float fStack_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  float fStack_1f84;
  int local_1f7c;
  undefined8 local_1f78;
  undefined8 local_1f70;
  undefined8 local_1f68;
  undefined4 local_1f60;
  Allocator *local_1f58;
  undefined4 local_1f50;
  undefined4 local_1f4c;
  undefined4 local_1f48;
  undefined4 local_1f44;
  undefined4 local_1f40;
  undefined8 local_1f38;
  undefined1 (*local_1f30) [32];
  undefined8 local_1f28;
  undefined8 local_1f20;
  undefined8 local_1f18;
  undefined4 local_1f10;
  Allocator *local_1f08;
  undefined4 local_1f00;
  undefined4 local_1efc;
  undefined4 local_1ef8;
  undefined4 local_1ef4;
  undefined4 local_1ef0;
  undefined8 local_1ee8;
  float *local_1ee0;
  int local_1ed4;
  const_reference local_1ed0;
  ulong local_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  float local_1eb0;
  float fStack_1eac;
  float fStack_1ea8;
  float fStack_1ea4;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  float local_1e80;
  float fStack_1e7c;
  float fStack_1e78;
  float fStack_1e74;
  float fStack_1e70;
  float fStack_1e6c;
  float fStack_1e68;
  float fStack_1e64;
  int local_1e44;
  undefined8 local_1e40;
  undefined8 local_1e38;
  undefined8 local_1e30;
  undefined4 local_1e28;
  Allocator *local_1e20;
  undefined4 local_1e18;
  undefined4 local_1e14;
  undefined4 local_1e10;
  undefined4 local_1e0c;
  undefined4 local_1e08;
  undefined8 local_1e00;
  undefined1 (*local_1df8) [32];
  undefined8 local_1df0;
  undefined8 local_1de8;
  undefined8 local_1de0;
  undefined4 local_1dd8;
  Allocator *local_1dd0;
  undefined4 local_1dc8;
  undefined4 local_1dc4;
  undefined4 local_1dc0;
  undefined4 local_1dbc;
  undefined4 local_1db8;
  undefined8 local_1db0;
  float *local_1da8;
  undefined8 local_1da0;
  undefined8 local_1d98;
  undefined8 local_1d90;
  undefined4 local_1d88;
  Allocator *local_1d80;
  undefined4 local_1d78;
  undefined4 local_1d74;
  undefined4 local_1d70;
  undefined4 local_1d6c;
  undefined4 local_1d68;
  undefined8 local_1d60;
  undefined1 (*local_1d58) [12];
  int local_1d4c;
  const_reference local_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  float local_1d30;
  float fStack_1d2c;
  float fStack_1d28;
  float fStack_1d24;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  float local_1d00;
  float fStack_1cfc;
  float fStack_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  float fStack_1ce8;
  undefined4 uStack_1ce4;
  int local_1cdc;
  undefined8 local_1cd8;
  undefined8 local_1cd0;
  undefined8 local_1cc8;
  undefined4 local_1cc0;
  Allocator *local_1cb8;
  undefined4 local_1cb0;
  undefined4 local_1cac;
  undefined4 local_1ca8;
  undefined4 local_1ca4;
  undefined4 local_1ca0;
  undefined8 local_1c98;
  undefined1 (*local_1c90) [32];
  undefined8 local_1c88;
  undefined8 local_1c80;
  undefined8 local_1c78;
  undefined4 local_1c70;
  Allocator *local_1c68;
  undefined4 local_1c60;
  undefined4 local_1c5c;
  undefined4 local_1c58;
  undefined4 local_1c54;
  undefined4 local_1c50;
  undefined8 local_1c48;
  float *local_1c40;
  int local_1c34;
  const_reference local_1c30;
  ulong local_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  float local_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  float local_1be0;
  float fStack_1bdc;
  float fStack_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  float fStack_1bc8;
  undefined4 uStack_1bc4;
  int local_1bac;
  undefined8 local_1ba8;
  undefined8 local_1ba0;
  undefined8 local_1b98;
  undefined4 local_1b90;
  Allocator *local_1b88;
  undefined4 local_1b80;
  undefined4 local_1b7c;
  undefined4 local_1b78;
  undefined4 local_1b74;
  undefined4 local_1b70;
  undefined8 local_1b68;
  undefined1 (*local_1b60) [32];
  undefined8 local_1b58;
  undefined8 local_1b50;
  undefined8 local_1b48;
  undefined4 local_1b40;
  Allocator *local_1b38;
  undefined4 local_1b30;
  undefined4 local_1b2c;
  undefined4 local_1b28;
  undefined4 local_1b24;
  undefined4 local_1b20;
  undefined8 local_1b18;
  float *local_1b10;
  undefined8 local_1af8;
  undefined8 local_1af0;
  undefined8 local_1ae8;
  undefined4 local_1ae0;
  Allocator *local_1ad8;
  undefined4 local_1ad0;
  undefined4 local_1acc;
  undefined4 local_1ac8;
  undefined4 local_1ac4;
  undefined4 local_1ac0;
  undefined8 local_1ab8;
  undefined1 (*local_1ab0) [12];
  int local_1aa4;
  const_reference local_1aa0;
  reference local_1a98;
  int local_1a8c;
  int local_1a88;
  int local_1a84;
  int local_1a80;
  int local_1a7c;
  const_reference local_1a78;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a68;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a60;
  int local_1a4c;
  reference local_1a48;
  undefined1 local_1a3d;
  int local_1a3c;
  const_reference local_1a38;
  undefined8 *local_1a30;
  undefined1 local_1a25;
  int local_1a24;
  const_reference local_1a20;
  undefined8 *local_1a18;
  undefined1 local_1a0d;
  int local_1a0c;
  const_reference local_1a08;
  undefined8 *local_1a00;
  undefined1 local_19f5;
  int local_19f4;
  const_reference local_19f0;
  undefined8 *local_19e8;
  undefined1 local_19dd;
  int local_19dc;
  const_reference local_19d8;
  undefined8 *local_19d0;
  undefined1 local_19c5;
  int local_19c4;
  const_reference local_19c0;
  undefined8 *local_19b8;
  undefined1 local_19ad;
  int local_19ac;
  const_reference local_19a8;
  undefined8 *local_19a0;
  undefined1 local_1995;
  int local_1994;
  const_reference local_1990;
  undefined8 *local_1988;
  undefined1 local_197d;
  int local_197c;
  const_reference local_1978;
  undefined8 *local_1970;
  undefined1 local_1965;
  int local_1964;
  const_reference local_1960;
  undefined8 *local_1958;
  undefined1 local_194d;
  int local_194c;
  const_reference local_1948;
  undefined8 *local_1940;
  undefined1 local_1935;
  int local_1934;
  const_reference local_1930;
  undefined8 *local_1928;
  undefined8 *local_1920;
  undefined8 *local_1918;
  undefined8 *local_1910;
  undefined8 *local_1908;
  undefined8 *local_1900;
  undefined8 *local_18f8;
  undefined8 *local_18f0;
  undefined8 *local_18e8;
  undefined8 *local_18e0;
  undefined8 *local_18d8;
  undefined8 *local_18d0;
  undefined8 *local_18c8;
  undefined8 *local_1860;
  undefined8 *local_1850;
  undefined8 *local_1840;
  undefined8 *local_1830;
  undefined8 *local_1820;
  undefined8 *local_1810;
  undefined8 *local_1800;
  undefined8 *local_17f0;
  undefined8 *local_17e0;
  undefined8 *local_17d0;
  undefined8 *local_17c0;
  undefined8 *local_17b0;
  undefined8 *local_17a0;
  undefined8 *local_1790;
  undefined8 *local_1780;
  undefined8 *local_1770;
  undefined8 *local_1760;
  undefined8 *local_1750;
  undefined8 *local_1740;
  undefined8 *local_1730;
  undefined1 local_171d;
  int local_171c;
  reference local_1718;
  undefined8 *local_1710;
  undefined1 local_16fd;
  int local_16fc;
  reference local_16f8;
  undefined8 *local_16f0;
  undefined1 local_16dd;
  int local_16dc;
  reference local_16d8;
  undefined8 *local_16d0;
  undefined1 local_16bd;
  int local_16bc;
  reference local_16b8;
  undefined8 *local_16b0;
  undefined1 local_169d;
  int local_169c;
  reference local_1698;
  undefined8 *local_1690;
  undefined1 local_167d;
  int local_167c;
  reference local_1678;
  undefined8 *local_1670;
  undefined1 local_165d;
  int local_165c;
  reference local_1658;
  undefined8 *local_1650;
  undefined1 local_163d;
  int local_163c;
  reference local_1638;
  undefined8 *local_1630;
  undefined8 *local_1620;
  undefined8 *local_1618;
  undefined8 *local_1610;
  undefined8 *local_1608;
  undefined8 *local_1600;
  undefined8 *local_15f8;
  undefined8 *local_15f0;
  undefined8 *local_15e8;
  undefined1 (*local_15e0) [32];
  undefined1 (*local_15d8) [32];
  undefined1 (*local_15d0) [32];
  undefined1 (*local_15c8) [32];
  float *local_15c0;
  undefined1 (*local_15b8) [16];
  float *local_15b0;
  float *local_15a8;
  float *local_15a0;
  undefined1 (*local_1598) [32];
  float *local_1590;
  undefined1 (*local_1588) [12];
  float *local_1580;
  undefined1 (*local_1578) [32];
  float *local_1570;
  undefined1 (*local_1568) [12];
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined1 local_1500 [8];
  float fStack_14f8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [8];
  float fStack_14b8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 (*local_1468) [32];
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 (*local_1428) [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 (*local_13e8) [16];
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 (*local_13a8) [16];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 (*local_1368) [32];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 (*local_1328) [32];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 (*local_12e8) [32];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 (*local_12a8) [32];
  undefined1 (*local_12a0) [32];
  undefined1 (*local_1298) [32];
  undefined1 (*local_1290) [32];
  undefined1 (*local_1288) [32];
  undefined1 (*local_1280) [16];
  float *local_1278;
  float *local_1270;
  float *local_1268;
  float *local_1260;
  undefined1 (*local_1258) [32];
  float *local_1250;
  undefined1 (*local_1248) [12];
  float *local_1240;
  undefined1 (*local_1238) [32];
  float *local_1230;
  undefined1 (*local_1228) [12];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined1 local_11b0 [8];
  float fStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined1 local_1190 [8];
  float fStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined1 (*local_1168) [32];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined1 (*local_1148) [32];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined1 (*local_1128) [16];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined1 (*local_1108) [16];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined1 (*local_10e8) [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined1 (*local_10c8) [32];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined1 (*local_10a8) [32];
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined1 (*local_1088) [32];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined1 local_1060 [8];
  float fStack_1058;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [8];
  float fStack_1018;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined1 local_fb0 [8];
  float fStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined1 local_f90 [8];
  float fStack_f88;
  size_type local_f80;
  long *local_f78;
  undefined8 local_f70;
  long *local_f68;
  undefined8 local_f60;
  undefined8 *local_f58;
  float local_f4c;
  float local_f48;
  float local_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined1 local_e80 [32];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0;
  float fStack_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined1 local_da0 [32];
  float local_d80;
  float fStack_d7c;
  float fStack_d78;
  float fStack_d74;
  float local_d64;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  float local_d44;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float local_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  reference local_c48;
  Allocator *local_c40;
  int local_c34;
  size_t local_c30;
  undefined1 (*local_c28) [32];
  int local_c1c;
  int local_c18;
  int local_c14;
  undefined8 *local_c10;
  Allocator *local_c08;
  int local_bfc;
  size_t local_bf8;
  undefined1 (*local_bf0) [32];
  int local_be4;
  int local_be0;
  int local_bdc;
  undefined8 *local_bd8;
  Allocator *local_bd0;
  int local_bc4;
  size_t local_bc0;
  undefined1 (*local_bb8) [32];
  int local_bac;
  int local_ba8;
  int local_ba4;
  undefined8 *local_ba0;
  Allocator *local_b98;
  int local_b8c;
  size_t local_b88;
  undefined1 (*local_b80) [32];
  int local_b74;
  int local_b70;
  int local_b6c;
  undefined8 *local_b68;
  Allocator *local_b60;
  int local_b54;
  size_t local_b50;
  undefined1 (*local_b48) [16];
  int local_b3c;
  int local_b38;
  int local_b34;
  undefined8 *local_b30;
  Allocator *local_b28;
  int local_b1c;
  size_t local_b18;
  undefined1 (*local_b10) [16];
  int local_b04;
  int local_b00;
  int local_afc;
  undefined8 *local_af8;
  Allocator *local_af0;
  int local_ae4;
  size_t local_ae0;
  undefined1 (*local_ad8) [32];
  int local_acc;
  int local_ac8;
  int local_ac4;
  undefined8 *local_ac0;
  Allocator *local_ab8;
  int local_aac;
  size_t local_aa8;
  undefined1 (*local_aa0) [32];
  int local_a94;
  int local_a90;
  int local_a8c;
  undefined8 *local_a88;
  Allocator *local_a80;
  int local_a74;
  size_t local_a70;
  undefined1 (*local_a68) [12];
  int local_a5c;
  int local_a58;
  int local_a54;
  undefined8 *local_a50;
  Allocator *local_a48;
  int local_a3c;
  size_t local_a38;
  float *local_a30;
  int local_a24;
  int local_a20;
  int local_a1c;
  undefined8 *local_a18;
  Allocator *local_a10;
  int local_a04;
  size_t local_a00;
  float *local_9f8;
  int local_9ec;
  int local_9e8;
  int local_9e4;
  undefined8 *local_9e0;
  Allocator *local_9d8;
  int local_9cc;
  size_t local_9c8;
  undefined1 (*local_9c0) [12];
  int local_9b4;
  int local_9b0;
  int local_9ac;
  undefined8 *local_9a8;
  Allocator *local_9a0;
  int local_994;
  size_t local_990;
  float *local_988;
  int local_97c;
  int local_978;
  int local_974;
  undefined8 *local_970;
  Allocator *local_968;
  int local_95c;
  size_t local_958;
  float *local_950;
  int local_944;
  int local_940;
  int local_93c;
  undefined8 *local_938;
  Allocator *local_930;
  int local_924;
  size_t local_920;
  float *local_918;
  int local_90c;
  int local_908;
  int local_904;
  undefined8 *local_900;
  Allocator *local_8f8;
  int local_8ec;
  size_t local_8e8;
  float *local_8e0;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  undefined8 *local_8c8;
  Allocator *local_8c0;
  int local_8b4;
  size_t local_8b0;
  float *local_8a8;
  int local_89c;
  int local_898;
  int local_894;
  undefined8 *local_890;
  Allocator *local_888;
  int local_87c;
  size_t local_878;
  undefined1 (*local_870) [32];
  int local_864;
  int local_860;
  int local_85c;
  undefined8 *local_858;
  Allocator *local_850;
  int local_844;
  size_t local_840;
  undefined1 (*local_838) [32];
  int local_82c;
  int local_828;
  int local_824;
  undefined8 *local_820;
  Allocator *local_818;
  int local_80c;
  size_t local_808;
  undefined1 (*local_800) [32];
  int local_7f4;
  int local_7f0;
  int local_7ec;
  undefined8 *local_7e8;
  undefined4 local_7dc;
  long local_7d8;
  undefined4 local_7cc;
  long local_7c8;
  undefined4 local_7bc;
  long local_7b8;
  undefined4 local_7ac;
  long local_7a8;
  undefined4 local_79c;
  long local_798;
  undefined4 local_78c;
  long local_788;
  undefined4 local_77c;
  long local_778;
  undefined4 local_76c;
  long local_768;
  undefined4 local_75c;
  long local_758;
  undefined4 local_74c;
  long local_748;
  undefined4 local_73c;
  long local_738;
  undefined4 local_72c;
  long local_728;
  undefined4 local_71c;
  long local_718;
  undefined4 local_70c;
  long local_708;
  undefined4 local_6fc;
  long local_6f8;
  undefined4 local_6ec;
  long local_6e8;
  undefined4 local_6dc;
  long local_6d8;
  undefined4 local_6cc;
  long local_6c8;
  undefined4 local_6bc;
  long local_6b8;
  undefined4 local_6ac;
  long local_6a8;
  undefined8 *local_608;
  undefined8 *local_5e8;
  undefined8 *local_5c8;
  undefined8 *local_5a8;
  undefined8 *local_588;
  undefined8 *local_568;
  undefined8 *local_548;
  undefined8 *local_528;
  undefined8 *local_508;
  undefined8 *local_4e8;
  undefined8 *local_4c8;
  undefined8 *local_4a8;
  undefined8 *local_488;
  undefined8 *local_468;
  undefined8 *local_448;
  undefined8 *local_428;
  undefined8 *local_408;
  undefined8 *local_3e8;
  undefined8 *local_3c8;
  undefined8 *local_3a8;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_1a68 = in_RDX;
  local_1a60 = in_RSI;
  local_1a78 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1a7c = local_1a78->w;
  local_1a80 = local_1a78->h;
  local_1a84 = local_1a78->c;
  local_1a88 = local_1a78->elempack;
  local_1a8c = local_1a7c * local_1a80 * local_1a88;
  local_1a98 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a68,0);
  Mat::create_like(in_stack_ffffffffffffd708,in_stack_ffffffffffffd700,in_stack_ffffffffffffd6f8);
  local_1a48 = local_1a98;
  bVar28 = true;
  if (local_1a98->data != (void *)0x0) {
    local_c48 = local_1a98;
    bVar28 = local_1a98->cstep * (long)local_1a98->c == 0;
  }
  if (bVar28) {
    local_1a4c = -100;
  }
  else {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_1aa0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a60,1);
      for (local_1aa4 = 0; local_1aa4 < local_1a84; local_1aa4 = local_1aa4 + 1) {
        local_1928 = &local_1af8;
        local_a54 = local_1a78->w;
        local_a58 = local_1a78->h;
        local_a5c = local_1a78->d;
        local_a68 = (undefined1 (*) [12])
                    ((long)local_1a78->data +
                    local_1a78->cstep * (long)local_1aa4 * local_1a78->elemsize);
        local_a70 = local_1a78->elemsize;
        local_a74 = local_1a78->elempack;
        local_a80 = local_1a78->allocator;
        local_a50 = &local_1af8;
        local_728 = (long)local_a54 * (long)local_a58 * local_a70;
        local_18c8 = &local_1af8;
        local_1860 = &local_1af8;
        local_1940 = &local_1b58;
        local_a1c = local_1aa0->w;
        local_a20 = local_1aa0->h;
        local_a24 = local_1aa0->d;
        local_a30 = (float *)((long)local_1aa0->data +
                             local_1aa0->cstep * (long)local_1aa4 * local_1aa0->elemsize);
        local_a38 = local_1aa0->elemsize;
        local_a3c = local_1aa0->elempack;
        local_a48 = local_1aa0->allocator;
        local_a18 = &local_1b58;
        local_738 = (long)local_a1c * (long)local_a20 * local_a38;
        local_18d0 = &local_1b58;
        local_1850 = &local_1b58;
        local_1ac0 = 0;
        local_1ac4 = 0;
        local_1ac8 = 0;
        local_1acc = 0;
        local_1ae0 = 0;
        local_1ae8 = 0;
        local_1af0 = 0;
        local_1af8 = 0;
        local_72c = 0x10;
        local_73c = 0x10;
        local_1930 = local_1a78;
        local_1934 = local_1aa4;
        local_1935 = 1;
        local_194c = local_1aa4;
        local_194d = 1;
        local_1ab8 = 0;
        local_1ad0 = 0;
        local_1b58 = 0;
        local_1b48 = 0;
        local_1b40 = 0;
        local_1b2c = 0;
        local_1b28 = 0;
        local_1b24 = 0;
        local_1b20 = 0;
        local_1b50 = 0;
        local_1630 = &local_1ba8;
        local_c14 = local_1a98->w;
        local_c18 = local_1a98->h;
        local_c1c = local_1a98->d;
        local_c28 = (undefined1 (*) [32])
                    ((long)local_1a98->data +
                    local_1a98->cstep * (long)local_1aa4 * local_1a98->elemsize);
        local_c30 = local_1a98->elemsize;
        local_c34 = local_1a98->elempack;
        local_c40 = local_1a98->allocator;
        local_c10 = &local_1ba8;
        local_6a8 = (long)local_c14 * (long)local_c18 * local_c30;
        local_6ac = 0x10;
        local_1638 = local_1a98;
        local_163c = local_1aa4;
        local_163d = 1;
        local_1b18 = 0;
        local_1b30 = 0;
        local_15e8 = &local_1ba8;
        local_1840 = &local_1ba8;
        local_1ba8 = 0;
        local_1b98 = 0;
        local_1b90 = 0;
        local_1b80 = 0;
        local_1b7c = 0;
        local_1b78 = 0;
        local_1b74 = 0;
        local_1b70 = 0;
        local_1b68 = 0;
        local_1ba0 = 0;
        local_1b60 = local_c28;
        local_1b10 = local_a30;
        local_1ab0 = local_a68;
        for (local_1bac = 0; local_1bac + 7 < local_1a8c; local_1bac = local_1bac + 8) {
          local_1568 = local_1ab0;
          auVar23 = *local_1ab0;
          fStack_1bd4 = (float)((ulong)*(undefined8 *)(*local_1ab0 + 8) >> 0x20);
          fStack_1bd0 = (float)*(undefined8 *)(local_1ab0[1] + 4);
          fStack_1bcc = (float)((ulong)*(undefined8 *)(local_1ab0[1] + 4) >> 0x20);
          fStack_1bc8 = (float)*(undefined8 *)local_1ab0[2];
          uStack_1bc4 = (undefined4)((ulong)*(undefined8 *)local_1ab0[2] >> 0x20);
          local_1570 = local_1b10;
          local_1c00 = *(undefined8 *)local_1b10;
          uStack_1bf8 = *(undefined8 *)(local_1b10 + 2);
          uStack_1bf0 = *(undefined8 *)(local_1b10 + 4);
          uStack_1be8 = *(undefined8 *)(local_1b10 + 6);
          auVar3._12_4_ = fStack_1bd4;
          auVar3._0_12_ = auVar23;
          auVar3._16_4_ = fStack_1bd0;
          auVar3._20_4_ = fStack_1bcc;
          auVar3._24_4_ = fStack_1bc8;
          auVar3._28_4_ = uStack_1bc4;
          local_14c0._0_4_ = auVar23._0_4_;
          local_14c0._4_4_ = auVar23._4_4_;
          fStack_14b8 = auVar23._8_4_;
          local_14e0._0_4_ = (float)local_1c00;
          local_14e0._4_4_ = (float)((ulong)local_1c00 >> 0x20);
          uStack_14d8._0_4_ = (float)uStack_1bf8;
          uStack_14d8._4_4_ = (float)((ulong)uStack_1bf8 >> 0x20);
          uStack_14d0._0_4_ = (float)uStack_1bf0;
          uStack_14d0._4_4_ = (float)((ulong)uStack_1bf0 >> 0x20);
          uStack_14c8._0_4_ = (float)uStack_1be8;
          local_1be0 = (float)local_14c0._0_4_ * (float)local_14e0;
          fStack_1bdc = (float)local_14c0._4_4_ * local_14e0._4_4_;
          fStack_1bd8 = fStack_14b8 * (float)uStack_14d8;
          fStack_1bd4 = fStack_1bd4 * uStack_14d8._4_4_;
          fStack_1bd0 = fStack_1bd0 * (float)uStack_14d0;
          fStack_1bcc = fStack_1bcc * uStack_14d0._4_4_;
          fStack_1bc8 = fStack_1bc8 * (float)uStack_14c8;
          local_12a8 = local_1b60;
          local_12e0 = CONCAT44(fStack_1bdc,local_1be0);
          uStack_12d8 = CONCAT44(fStack_1bd4,fStack_1bd8);
          uStack_12d0 = CONCAT44(fStack_1bcc,fStack_1bd0);
          uStack_12c8 = CONCAT44(uStack_1bc4,fStack_1bc8);
          auVar17._8_8_ = uStack_12d8;
          auVar17._0_8_ = local_12e0;
          auVar17._16_8_ = uStack_12d0;
          auVar17._24_8_ = uStack_12c8;
          *local_1b60 = auVar17;
          local_1ab0 = (undefined1 (*) [12])(local_1ab0[2] + 8);
          local_1b10 = local_1b10 + 8;
          local_1b60 = local_1b60 + 1;
          local_14e0 = local_1c00;
          uStack_14d8 = uStack_1bf8;
          uStack_14d0 = uStack_1bf0;
          uStack_14c8 = uStack_1be8;
          _local_14c0 = auVar3;
        }
        for (; local_1bac + 3 < local_1a8c; local_1bac = local_1bac + 4) {
          local_1228 = local_1ab0;
          auVar23 = *local_1ab0;
          fStack_1c04 = (float)((ulong)*(undefined8 *)(*local_1ab0 + 8) >> 0x20);
          local_1230 = local_1b10;
          local_1c20 = *(undefined8 *)local_1b10;
          uStack_1c18 = *(undefined8 *)(local_1b10 + 2);
          auVar2._12_4_ = fStack_1c04;
          auVar2._0_12_ = auVar23;
          local_1190._0_4_ = auVar23._0_4_;
          local_1190._4_4_ = auVar23._4_4_;
          fStack_1188 = auVar23._8_4_;
          local_11a0._0_4_ = (float)local_1c20;
          local_11a0._4_4_ = (float)((ulong)local_1c20 >> 0x20);
          uStack_1198._0_4_ = (float)uStack_1c18;
          uStack_1198._4_4_ = (float)((ulong)uStack_1c18 >> 0x20);
          local_1c10 = (float)local_1190._0_4_ * (float)local_11a0;
          fStack_1c0c = (float)local_1190._4_4_ * local_11a0._4_4_;
          fStack_1c08 = fStack_1188 * (float)uStack_1198;
          fStack_1c04 = fStack_1c04 * uStack_1198._4_4_;
          local_1088 = local_1b60;
          local_10a0 = CONCAT44(fStack_1c0c,local_1c10);
          uStack_1098 = CONCAT44(fStack_1c04,fStack_1c08);
          auVar1._8_8_ = uStack_1098;
          auVar1._0_8_ = local_10a0;
          *(undefined1 (*) [16])*local_1b60 = auVar1;
          local_1ab0 = (undefined1 (*) [12])(local_1ab0[1] + 4);
          local_1b10 = local_1b10 + 4;
          local_1b60 = (undefined1 (*) [32])(*local_1b60 + 0x10);
          local_11a0 = local_1c20;
          uStack_1198 = uStack_1c18;
          _local_1190 = auVar2;
        }
        for (; local_1bac < local_1a8c; local_1bac = local_1bac + 1) {
          *(float *)*local_1b60 = *(float *)*local_1ab0 * *local_1b10;
          local_1ab0 = (undefined1 (*) [12])(*local_1ab0 + 4);
          local_1b10 = local_1b10 + 1;
          local_1b60 = (undefined1 (*) [32])(*local_1b60 + 4);
        }
        local_1948 = local_1aa0;
        local_3e8 = local_1840;
        local_3c8 = local_1850;
        local_3a8 = local_1860;
        local_1b88 = local_c40;
        local_1b38 = local_a48;
        local_1ad8 = local_a80;
      }
      for (local_1c28 = 2; uVar25 = local_1c28,
          sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1a60),
          uVar25 < sVar26; local_1c28 = local_1c28 + 1) {
        local_1c30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_1a60,local_1c28);
        for (local_1c34 = 0; local_1c34 < local_1a84; local_1c34 = local_1c34 + 1) {
          local_1958 = &local_1c88;
          local_9e4 = local_1c30->w;
          local_9e8 = local_1c30->h;
          local_9ec = local_1c30->d;
          local_9f8 = (float *)((long)local_1c30->data +
                               local_1c30->cstep * (long)local_1c34 * local_1c30->elemsize);
          local_a00 = local_1c30->elemsize;
          local_a04 = local_1c30->elempack;
          local_a10 = local_1c30->allocator;
          local_9e0 = &local_1c88;
          local_748 = (long)local_9e4 * (long)local_9e8 * local_a00;
          local_18d8 = &local_1c88;
          local_1830 = &local_1c88;
          local_74c = 0x10;
          local_1964 = local_1c34;
          local_1965 = 1;
          local_1c88 = 0;
          local_1c78 = 0;
          local_1c70 = 0;
          local_1c5c = 0;
          local_1c58 = 0;
          local_1c54 = 0;
          local_1c50 = 0;
          local_1c80 = 0;
          local_1650 = &local_1cd8;
          local_bdc = local_1a98->w;
          local_be0 = local_1a98->h;
          local_be4 = local_1a98->d;
          local_bf0 = (undefined1 (*) [32])
                      ((long)local_1a98->data +
                      local_1a98->cstep * (long)local_1c34 * local_1a98->elemsize);
          local_bf8 = local_1a98->elemsize;
          local_bfc = local_1a98->elempack;
          local_c08 = local_1a98->allocator;
          local_bd8 = &local_1cd8;
          local_6b8 = (long)local_bdc * (long)local_be0 * local_bf8;
          local_6bc = 0x10;
          local_1658 = local_1a98;
          local_165c = local_1c34;
          local_165d = 1;
          local_1c48 = 0;
          local_1c60 = 0;
          local_15f0 = &local_1cd8;
          local_1820 = &local_1cd8;
          local_1cd8 = 0;
          local_1cc8 = 0;
          local_1cc0 = 0;
          local_1cb0 = 0;
          local_1cac = 0;
          local_1ca8 = 0;
          local_1ca4 = 0;
          local_1ca0 = 0;
          local_1c98 = 0;
          local_1cd0 = 0;
          local_1c90 = local_bf0;
          local_1c40 = local_9f8;
          for (local_1cdc = 0; local_1cdc + 7 < local_1a8c; local_1cdc = local_1cdc + 8) {
            local_1578 = local_1c90;
            auVar23 = *(undefined1 (*) [12])*local_1c90;
            fStack_1cf4 = (float)((ulong)*(undefined8 *)(*local_1c90 + 8) >> 0x20);
            fStack_1cf0 = (float)*(undefined8 *)(*local_1c90 + 0x10);
            fStack_1cec = (float)((ulong)*(undefined8 *)(*local_1c90 + 0x10) >> 0x20);
            fStack_1ce8 = (float)*(undefined8 *)(*local_1c90 + 0x18);
            uStack_1ce4 = (undefined4)((ulong)*(undefined8 *)(*local_1c90 + 0x18) >> 0x20);
            local_1580 = local_1c40;
            local_1d20 = *(undefined8 *)local_1c40;
            uStack_1d18 = *(undefined8 *)(local_1c40 + 2);
            uStack_1d10 = *(undefined8 *)(local_1c40 + 4);
            uStack_1d08 = *(undefined8 *)(local_1c40 + 6);
            auVar13._12_4_ = fStack_1cf4;
            auVar13._0_12_ = auVar23;
            auVar13._16_4_ = fStack_1cf0;
            auVar13._20_4_ = fStack_1cec;
            auVar13._24_4_ = fStack_1ce8;
            auVar13._28_4_ = uStack_1ce4;
            local_1500._0_4_ = auVar23._0_4_;
            local_1500._4_4_ = auVar23._4_4_;
            fStack_14f8 = auVar23._8_4_;
            local_1520._0_4_ = (float)local_1d20;
            local_1520._4_4_ = (float)((ulong)local_1d20 >> 0x20);
            uStack_1518._0_4_ = (float)uStack_1d18;
            uStack_1518._4_4_ = (float)((ulong)uStack_1d18 >> 0x20);
            uStack_1510._0_4_ = (float)uStack_1d10;
            uStack_1510._4_4_ = (float)((ulong)uStack_1d10 >> 0x20);
            uStack_1508._0_4_ = (float)uStack_1d08;
            local_1d00 = (float)local_1500._0_4_ * (float)local_1520;
            fStack_1cfc = (float)local_1500._4_4_ * local_1520._4_4_;
            fStack_1cf8 = fStack_14f8 * (float)uStack_1518;
            fStack_1cf4 = fStack_1cf4 * uStack_1518._4_4_;
            fStack_1cf0 = fStack_1cf0 * (float)uStack_1510;
            fStack_1cec = fStack_1cec * uStack_1510._4_4_;
            fStack_1ce8 = fStack_1ce8 * (float)uStack_1508;
            local_12e8 = local_1c90;
            local_1320 = CONCAT44(fStack_1cfc,local_1d00);
            uStack_1318 = CONCAT44(fStack_1cf4,fStack_1cf8);
            uStack_1310 = CONCAT44(fStack_1cec,fStack_1cf0);
            uStack_1308 = CONCAT44(uStack_1ce4,fStack_1ce8);
            auVar16._8_8_ = uStack_1318;
            auVar16._0_8_ = local_1320;
            auVar16._16_8_ = uStack_1310;
            auVar16._24_8_ = uStack_1308;
            *local_1c90 = auVar16;
            local_1c40 = local_1c40 + 8;
            local_1c90 = local_1c90 + 1;
            local_1520 = local_1d20;
            uStack_1518 = uStack_1d18;
            uStack_1510 = uStack_1d10;
            uStack_1508 = uStack_1d08;
            _local_1500 = auVar13;
          }
          for (; local_1cdc + 3 < local_1a8c; local_1cdc = local_1cdc + 4) {
            local_1238 = local_1c90;
            auVar23 = *(undefined1 (*) [12])*local_1c90;
            fStack_1d24 = (float)((ulong)*(undefined8 *)(*local_1c90 + 8) >> 0x20);
            local_1240 = local_1c40;
            local_1d40 = *(undefined8 *)local_1c40;
            uStack_1d38 = *(undefined8 *)(local_1c40 + 2);
            auVar12._12_4_ = fStack_1d24;
            auVar12._0_12_ = auVar23;
            local_11b0._0_4_ = auVar23._0_4_;
            local_11b0._4_4_ = auVar23._4_4_;
            fStack_11a8 = auVar23._8_4_;
            local_11c0._0_4_ = (float)local_1d40;
            local_11c0._4_4_ = (float)((ulong)local_1d40 >> 0x20);
            uStack_11b8._0_4_ = (float)uStack_1d38;
            uStack_11b8._4_4_ = (float)((ulong)uStack_1d38 >> 0x20);
            local_1d30 = (float)local_11b0._0_4_ * (float)local_11c0;
            fStack_1d2c = (float)local_11b0._4_4_ * local_11c0._4_4_;
            fStack_1d28 = fStack_11a8 * (float)uStack_11b8;
            fStack_1d24 = fStack_1d24 * uStack_11b8._4_4_;
            local_10a8 = local_1c90;
            local_10c0 = CONCAT44(fStack_1d2c,local_1d30);
            uStack_10b8 = CONCAT44(fStack_1d24,fStack_1d28);
            auVar22._8_8_ = uStack_10b8;
            auVar22._0_8_ = local_10c0;
            *(undefined1 (*) [16])*local_1c90 = auVar22;
            local_1c40 = local_1c40 + 4;
            local_1c90 = (undefined1 (*) [32])(*local_1c90 + 0x10);
            local_11c0 = local_1d40;
            uStack_11b8 = uStack_1d38;
            _local_11b0 = auVar12;
          }
          for (; local_1cdc < local_1a8c; local_1cdc = local_1cdc + 1) {
            *(float *)*local_1c90 = *local_1c40 * *(float *)*local_1c90;
            local_1c40 = local_1c40 + 1;
            local_1c90 = (undefined1 (*) [32])(*local_1c90 + 4);
          }
          local_1960 = local_1c30;
          local_428 = local_1820;
          local_408 = local_1830;
          local_1cb8 = local_c08;
          local_1c68 = local_a10;
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_1d48 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a60,1);
        for (local_1d4c = 0; local_1d4c < local_1a84; local_1d4c = local_1d4c + 1) {
          local_1970 = &local_1da0;
          local_9ac = local_1a78->w;
          local_9b0 = local_1a78->h;
          local_9b4 = local_1a78->d;
          local_9c0 = (undefined1 (*) [12])
                      ((long)local_1a78->data +
                      local_1a78->cstep * (long)local_1d4c * local_1a78->elemsize);
          local_9c8 = local_1a78->elemsize;
          local_9cc = local_1a78->elempack;
          local_9d8 = local_1a78->allocator;
          local_9a8 = &local_1da0;
          local_758 = (long)local_9ac * (long)local_9b0 * local_9c8;
          local_18e0 = &local_1da0;
          local_1810 = &local_1da0;
          local_1988 = &local_1df0;
          local_974 = local_1d48->w;
          local_978 = local_1d48->h;
          local_97c = local_1d48->d;
          local_988 = (float *)((long)local_1d48->data +
                               local_1d48->cstep * (long)local_1d4c * local_1d48->elemsize);
          local_990 = local_1d48->elemsize;
          local_994 = local_1d48->elempack;
          local_9a0 = local_1d48->allocator;
          local_970 = &local_1df0;
          local_768 = (long)local_974 * (long)local_978 * local_990;
          local_18e8 = &local_1df0;
          local_1800 = &local_1df0;
          local_1d68 = 0;
          local_1d6c = 0;
          local_1d70 = 0;
          local_1d74 = 0;
          local_1d88 = 0;
          local_1d90 = 0;
          local_1d98 = 0;
          local_1da0 = 0;
          local_75c = 0x10;
          local_76c = 0x10;
          local_1978 = local_1a78;
          local_197c = local_1d4c;
          local_197d = 1;
          local_1994 = local_1d4c;
          local_1995 = 1;
          local_1d60 = 0;
          local_1d78 = 0;
          local_1df0 = 0;
          local_1de0 = 0;
          local_1dd8 = 0;
          local_1dc4 = 0;
          local_1dc0 = 0;
          local_1dbc = 0;
          local_1db8 = 0;
          local_1de8 = 0;
          local_1670 = &local_1e40;
          local_ba4 = local_1a98->w;
          local_ba8 = local_1a98->h;
          local_bac = local_1a98->d;
          local_bb8 = (undefined1 (*) [32])
                      ((long)local_1a98->data +
                      local_1a98->cstep * (long)local_1d4c * local_1a98->elemsize);
          local_bc0 = local_1a98->elemsize;
          local_bc4 = local_1a98->elempack;
          local_bd0 = local_1a98->allocator;
          local_ba0 = &local_1e40;
          local_6c8 = (long)local_ba4 * (long)local_ba8 * local_bc0;
          local_6cc = 0x10;
          local_1678 = local_1a98;
          local_167c = local_1d4c;
          local_167d = 1;
          local_1db0 = 0;
          local_1dc8 = 0;
          local_15f8 = &local_1e40;
          local_17f0 = &local_1e40;
          local_1e40 = 0;
          local_1e30 = 0;
          local_1e28 = 0;
          local_1e18 = 0;
          local_1e14 = 0;
          local_1e10 = 0;
          local_1e0c = 0;
          local_1e08 = 0;
          local_1e00 = 0;
          local_1e38 = 0;
          local_1df8 = local_bb8;
          local_1da8 = local_988;
          local_1d58 = local_9c0;
          for (local_1e44 = 0; local_1e44 + 7 < local_1a8c; local_1e44 = local_1e44 + 8) {
            local_1588 = local_1d58;
            auVar23 = *local_1d58;
            fStack_1e74 = (float)((ulong)*(undefined8 *)(*local_1d58 + 8) >> 0x20);
            fStack_1e70 = (float)*(undefined8 *)(local_1d58[1] + 4);
            fStack_1e6c = (float)((ulong)*(undefined8 *)(local_1d58[1] + 4) >> 0x20);
            fStack_1e68 = (float)*(undefined8 *)local_1d58[2];
            fStack_1e64 = (float)((ulong)*(undefined8 *)local_1d58[2] >> 0x20);
            local_1590 = local_1da8;
            local_1ea0 = *(undefined8 *)local_1da8;
            uStack_1e98 = *(undefined8 *)(local_1da8 + 2);
            uStack_1e90 = *(undefined8 *)(local_1da8 + 4);
            uStack_1e88 = *(undefined8 *)(local_1da8 + 6);
            auVar11._12_4_ = fStack_1e74;
            auVar11._0_12_ = auVar23;
            auVar11._16_4_ = fStack_1e70;
            auVar11._20_4_ = fStack_1e6c;
            auVar11._24_4_ = fStack_1e68;
            auVar11._28_4_ = fStack_1e64;
            local_1020._0_4_ = auVar23._0_4_;
            local_1020._4_4_ = auVar23._4_4_;
            fStack_1018 = auVar23._8_4_;
            local_1040._0_4_ = (float)local_1ea0;
            local_1040._4_4_ = (float)((ulong)local_1ea0 >> 0x20);
            uStack_1038._0_4_ = (float)uStack_1e98;
            uStack_1038._4_4_ = (float)((ulong)uStack_1e98 >> 0x20);
            uStack_1030._0_4_ = (float)uStack_1e90;
            uStack_1030._4_4_ = (float)((ulong)uStack_1e90 >> 0x20);
            uStack_1028._0_4_ = (float)uStack_1e88;
            uStack_1028._4_4_ = (float)((ulong)uStack_1e88 >> 0x20);
            local_1e80 = (float)local_1020._0_4_ + (float)local_1040;
            fStack_1e7c = (float)local_1020._4_4_ + local_1040._4_4_;
            fStack_1e78 = fStack_1018 + (float)uStack_1038;
            fStack_1e74 = fStack_1e74 + uStack_1038._4_4_;
            fStack_1e70 = fStack_1e70 + (float)uStack_1030;
            fStack_1e6c = fStack_1e6c + uStack_1030._4_4_;
            fStack_1e68 = fStack_1e68 + (float)uStack_1028;
            fStack_1e64 = fStack_1e64 + uStack_1028._4_4_;
            local_1328 = local_1df8;
            local_1360 = CONCAT44(fStack_1e7c,local_1e80);
            uStack_1358 = CONCAT44(fStack_1e74,fStack_1e78);
            uStack_1350 = CONCAT44(fStack_1e6c,fStack_1e70);
            uStack_1348 = CONCAT44(fStack_1e64,fStack_1e68);
            auVar15._8_8_ = uStack_1358;
            auVar15._0_8_ = local_1360;
            auVar15._16_8_ = uStack_1350;
            auVar15._24_8_ = uStack_1348;
            *local_1df8 = auVar15;
            local_1d58 = (undefined1 (*) [12])(local_1d58[2] + 8);
            local_1da8 = local_1da8 + 8;
            local_1df8 = local_1df8 + 1;
            local_1040 = local_1ea0;
            uStack_1038 = uStack_1e98;
            uStack_1030 = uStack_1e90;
            uStack_1028 = uStack_1e88;
            _local_1020 = auVar11;
          }
          for (; local_1e44 + 3 < local_1a8c; local_1e44 = local_1e44 + 4) {
            local_1248 = local_1d58;
            auVar23 = *local_1d58;
            fStack_1ea4 = (float)((ulong)*(undefined8 *)(*local_1d58 + 8) >> 0x20);
            local_1250 = local_1da8;
            local_1ec0 = *(undefined8 *)local_1da8;
            uStack_1eb8 = *(undefined8 *)(local_1da8 + 2);
            auVar10._12_4_ = fStack_1ea4;
            auVar10._0_12_ = auVar23;
            local_f90._0_4_ = auVar23._0_4_;
            local_f90._4_4_ = auVar23._4_4_;
            fStack_f88 = auVar23._8_4_;
            local_fa0._0_4_ = (float)local_1ec0;
            local_fa0._4_4_ = (float)((ulong)local_1ec0 >> 0x20);
            uStack_f98._0_4_ = (float)uStack_1eb8;
            uStack_f98._4_4_ = (float)((ulong)uStack_1eb8 >> 0x20);
            local_1eb0 = (float)local_f90._0_4_ + (float)local_fa0;
            fStack_1eac = (float)local_f90._4_4_ + local_fa0._4_4_;
            fStack_1ea8 = fStack_f88 + (float)uStack_f98;
            fStack_1ea4 = fStack_1ea4 + uStack_f98._4_4_;
            local_10c8 = local_1df8;
            local_10e0 = CONCAT44(fStack_1eac,local_1eb0);
            uStack_10d8 = CONCAT44(fStack_1ea4,fStack_1ea8);
            auVar21._8_8_ = uStack_10d8;
            auVar21._0_8_ = local_10e0;
            *(undefined1 (*) [16])*local_1df8 = auVar21;
            local_1d58 = (undefined1 (*) [12])(local_1d58[1] + 4);
            local_1da8 = local_1da8 + 4;
            local_1df8 = (undefined1 (*) [32])(*local_1df8 + 0x10);
            local_fa0 = local_1ec0;
            uStack_f98 = uStack_1eb8;
            _local_f90 = auVar10;
          }
          for (; local_1e44 < local_1a8c; local_1e44 = local_1e44 + 1) {
            *(float *)*local_1df8 = *(float *)*local_1d58 + *local_1da8;
            local_1d58 = (undefined1 (*) [12])(*local_1d58 + 4);
            local_1da8 = local_1da8 + 1;
            local_1df8 = (undefined1 (*) [32])(*local_1df8 + 4);
          }
          local_1990 = local_1d48;
          local_488 = local_17f0;
          local_468 = local_1800;
          local_448 = local_1810;
          local_1e20 = local_bd0;
          local_1dd0 = local_9a0;
          local_1d80 = local_9d8;
        }
        for (local_1ec8 = 2; uVar25 = local_1ec8,
            sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1a60),
            uVar25 < sVar26; local_1ec8 = local_1ec8 + 1) {
          local_1ed0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_1a60,local_1ec8);
          for (local_1ed4 = 0; local_1ed4 < local_1a84; local_1ed4 = local_1ed4 + 1) {
            local_19a0 = &local_1f28;
            local_93c = local_1ed0->w;
            local_940 = local_1ed0->h;
            local_944 = local_1ed0->d;
            local_950 = (float *)((long)local_1ed0->data +
                                 local_1ed0->cstep * (long)local_1ed4 * local_1ed0->elemsize);
            local_958 = local_1ed0->elemsize;
            local_95c = local_1ed0->elempack;
            local_968 = local_1ed0->allocator;
            local_938 = &local_1f28;
            local_778 = (long)local_93c * (long)local_940 * local_958;
            local_18f0 = &local_1f28;
            local_17e0 = &local_1f28;
            local_77c = 0x10;
            local_19ac = local_1ed4;
            local_19ad = 1;
            local_1f28 = 0;
            local_1f18 = 0;
            local_1f10 = 0;
            local_1efc = 0;
            local_1ef8 = 0;
            local_1ef4 = 0;
            local_1ef0 = 0;
            local_1f20 = 0;
            local_1690 = &local_1f78;
            local_b6c = local_1a98->w;
            local_b70 = local_1a98->h;
            local_b74 = local_1a98->d;
            local_b80 = (undefined1 (*) [32])
                        ((long)local_1a98->data +
                        local_1a98->cstep * (long)local_1ed4 * local_1a98->elemsize);
            local_b88 = local_1a98->elemsize;
            local_b8c = local_1a98->elempack;
            local_b98 = local_1a98->allocator;
            local_b68 = &local_1f78;
            local_6d8 = (long)local_b6c * (long)local_b70 * local_b88;
            local_6dc = 0x10;
            local_1698 = local_1a98;
            local_169c = local_1ed4;
            local_169d = 1;
            local_1ee8 = 0;
            local_1f00 = 0;
            local_1600 = &local_1f78;
            local_17d0 = &local_1f78;
            local_1f78 = 0;
            local_1f68 = 0;
            local_1f60 = 0;
            local_1f50 = 0;
            local_1f4c = 0;
            local_1f48 = 0;
            local_1f44 = 0;
            local_1f40 = 0;
            local_1f38 = 0;
            local_1f70 = 0;
            local_1f30 = local_b80;
            local_1ee0 = local_950;
            for (local_1f7c = 0; local_1f7c + 7 < local_1a8c; local_1f7c = local_1f7c + 8) {
              local_1598 = local_1f30;
              auVar23 = *(undefined1 (*) [12])*local_1f30;
              fStack_1f94 = (float)((ulong)*(undefined8 *)(*local_1f30 + 8) >> 0x20);
              fStack_1f90 = (float)*(undefined8 *)(*local_1f30 + 0x10);
              fStack_1f8c = (float)((ulong)*(undefined8 *)(*local_1f30 + 0x10) >> 0x20);
              fStack_1f88 = (float)*(undefined8 *)(*local_1f30 + 0x18);
              fStack_1f84 = (float)((ulong)*(undefined8 *)(*local_1f30 + 0x18) >> 0x20);
              local_15a0 = local_1ee0;
              local_1fc0 = *(undefined8 *)local_1ee0;
              uStack_1fb8 = *(undefined8 *)(local_1ee0 + 2);
              uStack_1fb0 = *(undefined8 *)(local_1ee0 + 4);
              uStack_1fa8 = *(undefined8 *)(local_1ee0 + 6);
              auVar9._12_4_ = fStack_1f94;
              auVar9._0_12_ = auVar23;
              auVar9._16_4_ = fStack_1f90;
              auVar9._20_4_ = fStack_1f8c;
              auVar9._24_4_ = fStack_1f88;
              auVar9._28_4_ = fStack_1f84;
              local_1060._0_4_ = auVar23._0_4_;
              local_1060._4_4_ = auVar23._4_4_;
              fStack_1058 = auVar23._8_4_;
              local_1080._0_4_ = (float)local_1fc0;
              local_1080._4_4_ = (float)((ulong)local_1fc0 >> 0x20);
              uStack_1078._0_4_ = (float)uStack_1fb8;
              uStack_1078._4_4_ = (float)((ulong)uStack_1fb8 >> 0x20);
              uStack_1070._0_4_ = (float)uStack_1fb0;
              uStack_1070._4_4_ = (float)((ulong)uStack_1fb0 >> 0x20);
              uStack_1068._0_4_ = (float)uStack_1fa8;
              uStack_1068._4_4_ = (float)((ulong)uStack_1fa8 >> 0x20);
              local_1fa0 = (float)local_1060._0_4_ + (float)local_1080;
              fStack_1f9c = (float)local_1060._4_4_ + local_1080._4_4_;
              fStack_1f98 = fStack_1058 + (float)uStack_1078;
              fStack_1f94 = fStack_1f94 + uStack_1078._4_4_;
              fStack_1f90 = fStack_1f90 + (float)uStack_1070;
              fStack_1f8c = fStack_1f8c + uStack_1070._4_4_;
              fStack_1f88 = fStack_1f88 + (float)uStack_1068;
              fStack_1f84 = fStack_1f84 + uStack_1068._4_4_;
              local_1368 = local_1f30;
              local_13a0 = CONCAT44(fStack_1f9c,local_1fa0);
              uStack_1398 = CONCAT44(fStack_1f94,fStack_1f98);
              uStack_1390 = CONCAT44(fStack_1f8c,fStack_1f90);
              uStack_1388 = CONCAT44(fStack_1f84,fStack_1f88);
              auVar14._8_8_ = uStack_1398;
              auVar14._0_8_ = local_13a0;
              auVar14._16_8_ = uStack_1390;
              auVar14._24_8_ = uStack_1388;
              *local_1f30 = auVar14;
              local_1ee0 = local_1ee0 + 8;
              local_1f30 = local_1f30 + 1;
              local_1080 = local_1fc0;
              uStack_1078 = uStack_1fb8;
              uStack_1070 = uStack_1fb0;
              uStack_1068 = uStack_1fa8;
              _local_1060 = auVar9;
            }
            for (; local_1f7c + 3 < local_1a8c; local_1f7c = local_1f7c + 4) {
              local_1258 = local_1f30;
              auVar23 = *(undefined1 (*) [12])*local_1f30;
              fStack_1fc4 = (float)((ulong)*(undefined8 *)(*local_1f30 + 8) >> 0x20);
              local_1260 = local_1ee0;
              local_1fe0 = *(undefined8 *)local_1ee0;
              uStack_1fd8 = *(undefined8 *)(local_1ee0 + 2);
              auVar8._12_4_ = fStack_1fc4;
              auVar8._0_12_ = auVar23;
              local_fb0._0_4_ = auVar23._0_4_;
              local_fb0._4_4_ = auVar23._4_4_;
              fStack_fa8 = auVar23._8_4_;
              local_fc0._0_4_ = (float)local_1fe0;
              local_fc0._4_4_ = (float)((ulong)local_1fe0 >> 0x20);
              uStack_fb8._0_4_ = (float)uStack_1fd8;
              uStack_fb8._4_4_ = (float)((ulong)uStack_1fd8 >> 0x20);
              local_1fd0 = (float)local_fb0._0_4_ + (float)local_fc0;
              fStack_1fcc = (float)local_fb0._4_4_ + local_fc0._4_4_;
              fStack_1fc8 = fStack_fa8 + (float)uStack_fb8;
              fStack_1fc4 = fStack_1fc4 + uStack_fb8._4_4_;
              local_10e8 = local_1f30;
              local_1100 = CONCAT44(fStack_1fcc,local_1fd0);
              uStack_10f8 = CONCAT44(fStack_1fc4,fStack_1fc8);
              auVar20._8_8_ = uStack_10f8;
              auVar20._0_8_ = local_1100;
              *(undefined1 (*) [16])*local_1f30 = auVar20;
              local_1ee0 = local_1ee0 + 4;
              local_1f30 = (undefined1 (*) [32])(*local_1f30 + 0x10);
              local_fc0 = local_1fe0;
              uStack_fb8 = uStack_1fd8;
              _local_fb0 = auVar8;
            }
            for (; local_1f7c < local_1a8c; local_1f7c = local_1f7c + 1) {
              *(float *)*local_1f30 = *local_1ee0 + *(float *)*local_1f30;
              local_1ee0 = local_1ee0 + 1;
              local_1f30 = (undefined1 (*) [32])(*local_1f30 + 4);
            }
            local_19a8 = local_1ed0;
            local_4c8 = local_17d0;
            local_4a8 = local_17e0;
            local_1f58 = local_b98;
            local_1f08 = local_968;
          }
        }
      }
      else {
        local_1fe8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a60,1);
        for (local_1fec = 0; local_1fec < local_1a84; local_1fec = local_1fec + 1) {
          local_19b8 = &local_2040;
          local_904 = local_1a78->w;
          local_908 = local_1a78->h;
          local_90c = local_1a78->d;
          local_918 = (float *)((long)local_1a78->data +
                               local_1a78->cstep * (long)local_1fec * local_1a78->elemsize);
          local_920 = local_1a78->elemsize;
          local_924 = local_1a78->elempack;
          local_930 = local_1a78->allocator;
          local_900 = &local_2040;
          local_788 = (long)local_904 * (long)local_908 * local_920;
          local_18f8 = &local_2040;
          local_17c0 = &local_2040;
          local_19d0 = &local_2090;
          local_8cc = local_1fe8->w;
          local_8d0 = local_1fe8->h;
          local_8d4 = local_1fe8->d;
          local_8e0 = (float *)((long)local_1fe8->data +
                               local_1fe8->cstep * (long)local_1fec * local_1fe8->elemsize);
          local_8e8 = local_1fe8->elemsize;
          local_8ec = local_1fe8->elempack;
          local_8f8 = local_1fe8->allocator;
          local_8c8 = &local_2090;
          local_798 = (long)local_8cc * (long)local_8d0 * local_8e8;
          local_1900 = &local_2090;
          local_17b0 = &local_2090;
          local_2008 = 0;
          local_200c = 0;
          local_2010 = 0;
          local_2014 = 0;
          local_2028 = 0;
          local_2030 = 0;
          local_2038 = 0;
          local_2040 = 0;
          local_78c = 0x10;
          local_79c = 0x10;
          local_19c0 = local_1a78;
          local_19c4 = local_1fec;
          local_19c5 = 1;
          local_19dc = local_1fec;
          local_19dd = 1;
          local_2000 = 0;
          local_2018 = 0;
          local_2090 = 0;
          local_2080 = 0;
          local_2078 = 0;
          local_2064 = 0;
          local_2060 = 0;
          local_205c = 0;
          local_2058 = 0;
          local_2088 = 0;
          local_16b0 = &local_20e0;
          local_b34 = local_1a98->w;
          local_b38 = local_1a98->h;
          local_b3c = local_1a98->d;
          local_b48 = (undefined1 (*) [16])
                      ((long)local_1a98->data +
                      local_1a98->cstep * (long)local_1fec * local_1a98->elemsize);
          local_b50 = local_1a98->elemsize;
          local_b54 = local_1a98->elempack;
          local_b60 = local_1a98->allocator;
          local_b30 = &local_20e0;
          local_6e8 = (long)local_b34 * (long)local_b38 * local_b50;
          local_6ec = 0x10;
          local_16b8 = local_1a98;
          local_16bc = local_1fec;
          local_16bd = 1;
          local_2050 = 0;
          local_2068 = 0;
          local_1608 = &local_20e0;
          local_17a0 = &local_20e0;
          local_20e0 = 0;
          local_20d0 = 0;
          local_20c8 = 0;
          local_20b8 = 0;
          local_20b4 = 0;
          local_20b0 = 0;
          local_20ac = 0;
          local_20a8 = 0;
          local_20a0 = 0;
          local_20d8 = 0;
          local_f58 = (undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
          local_f60 = 0;
          local_20e4 = *(float *)*local_f58;
          local_f68 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
          local_f70 = 1;
          local_20e8 = *(float *)(*local_f68 + 4);
          local_20ec = 0;
          auVar2 = vinsertps_avx(ZEXT416((uint)local_20e4),ZEXT416((uint)local_20e4),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20e4),0x20);
          local_100 = vinsertps_avx(auVar2,ZEXT416((uint)local_20e4),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)local_20e4),ZEXT416((uint)local_20e4),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20e4),0x20);
          auStack_f0 = vinsertps_avx(auVar2,ZEXT416((uint)local_20e4),0x30);
          local_2120 = local_100._0_8_;
          uStack_2118 = local_100._8_8_;
          uStack_2110 = auStack_f0._0_8_;
          uStack_2108 = auStack_f0._8_8_;
          auVar2 = vinsertps_avx(ZEXT416((uint)local_20e8),ZEXT416((uint)local_20e8),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20e8),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20e8),0x30);
          auVar1 = vinsertps_avx(ZEXT416((uint)local_20e8),ZEXT416((uint)local_20e8),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_20e8),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_20e8),0x30);
          auVar29._16_16_ = auVar2;
          auVar29._0_16_ = auVar1;
          local_c0._0_8_ = auVar1._0_8_;
          local_c0._8_8_ = auVar1._8_8_;
          local_c0._16_8_ = auVar2._0_8_;
          local_c0._24_8_ = auVar2._8_8_;
          local_2140 = local_c0._0_8_;
          uStack_2138 = local_c0._8_8_;
          uStack_2130 = local_c0._16_8_;
          uStack_2128 = local_c0._24_8_;
          local_2098 = local_b48;
          local_2048 = local_8e0;
          local_1ff8 = local_918;
          for (; local_20ec + 7 < local_1a8c; local_20ec = local_20ec + 8) {
            local_15a8 = local_1ff8;
            uVar4 = *(undefined8 *)local_1ff8;
            uVar5 = *(undefined8 *)(local_1ff8 + 2);
            uVar6 = *(undefined8 *)(local_1ff8 + 4);
            uVar7 = *(undefined8 *)(local_1ff8 + 6);
            local_15b0 = local_2048;
            local_2180 = *(undefined8 *)local_2048;
            uStack_2178 = *(undefined8 *)(local_2048 + 2);
            uStack_2170 = *(undefined8 *)(local_2048 + 4);
            uStack_2168 = *(undefined8 *)(local_2048 + 6);
            local_1540._0_4_ = (float)uVar4;
            local_1540._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_1538._0_4_ = (float)uVar5;
            uStack_1538._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_1530._0_4_ = (float)uVar6;
            uStack_1530._4_4_ = (float)((ulong)uVar6 >> 0x20);
            uStack_1528._0_4_ = (float)uVar7;
            uStack_1528._4_4_ = (float)((ulong)uVar7 >> 0x20);
            local_1560._0_4_ = local_100._0_4_;
            local_1560._4_4_ = local_100._4_4_;
            uStack_1558._0_4_ = local_100._8_4_;
            uStack_1558._4_4_ = local_100._12_4_;
            uStack_1550._0_4_ = auStack_f0._0_4_;
            uStack_1550._4_4_ = auStack_f0._4_4_;
            uStack_1548._0_4_ = auStack_f0._8_4_;
            local_2160 = CONCAT44(local_1540._4_4_ * local_1560._4_4_,
                                  (float)local_1540 * (float)local_1560);
            uStack_2158 = CONCAT44(uStack_1538._4_4_ * uStack_1558._4_4_,
                                   (float)uStack_1538 * (float)uStack_1558);
            uStack_2150 = CONCAT44(uStack_1530._4_4_ * uStack_1550._4_4_,
                                   (float)uStack_1530 * (float)uStack_1550);
            uStack_2148 = CONCAT44(uStack_1528._4_4_,(float)uStack_1528 * (float)uStack_1548);
            local_e40 = local_c0._0_8_;
            uStack_e38 = local_c0._8_8_;
            uStack_e30 = local_c0._16_8_;
            uStack_e28 = local_c0._24_8_;
            local_e60 = local_2160;
            uStack_e58 = uStack_2158;
            uStack_e50 = uStack_2150;
            uStack_e48 = uStack_2148;
            local_e20._0_4_ = (float)local_2180;
            local_de0 = (float)local_e20;
            local_e20._4_4_ = (float)((ulong)local_2180 >> 0x20);
            fStack_ddc = local_e20._4_4_;
            uStack_e18._0_4_ = (float)uStack_2178;
            fStack_dd8 = (float)uStack_e18;
            uStack_e18._4_4_ = (float)((ulong)uStack_2178 >> 0x20);
            fStack_dd4 = uStack_e18._4_4_;
            uStack_e10._0_4_ = (float)uStack_2170;
            fStack_dd0 = (float)uStack_e10;
            uStack_e10._4_4_ = (float)((ulong)uStack_2170 >> 0x20);
            fStack_dcc = uStack_e10._4_4_;
            uStack_e08._0_4_ = (float)uStack_2168;
            fStack_dc8 = (float)uStack_e08;
            uStack_e08._4_4_ = (float)((ulong)uStack_2168 >> 0x20);
            fStack_dc4 = uStack_e08._4_4_;
            local_e00._0_4_ = auVar1._0_4_;
            local_e00._4_4_ = auVar1._4_4_;
            uStack_df8._0_4_ = auVar1._8_4_;
            uStack_df8._4_4_ = auVar1._12_4_;
            uStack_df0._0_4_ = auVar2._0_4_;
            uStack_df0._4_4_ = auVar2._4_4_;
            uStack_de8._0_4_ = auVar2._8_4_;
            local_da0._4_4_ = local_e20._4_4_ * local_e00._4_4_;
            local_da0._0_4_ = (float)local_e20 * (float)local_e00;
            local_da0._8_4_ = (float)uStack_e18 * (float)uStack_df8;
            local_da0._12_4_ = uStack_e18._4_4_ * uStack_df8._4_4_;
            local_da0._16_4_ = (float)uStack_e10 * (float)uStack_df0;
            local_da0._20_4_ = uStack_e10._4_4_ * uStack_df0._4_4_;
            local_da0._24_4_ = (float)uStack_e08 * (float)uStack_de8;
            local_da0._28_4_ = uStack_e08._4_4_;
            local_dc0 = local_2160;
            uStack_db8 = uStack_2158;
            uStack_db0 = uStack_2150;
            uStack_da8 = uStack_2148;
            local_2160 = CONCAT44(local_e20._4_4_ * local_e00._4_4_ +
                                  local_1540._4_4_ * local_1560._4_4_,
                                  (float)local_e20 * (float)local_e00 +
                                  (float)local_1540 * (float)local_1560);
            uStack_2158 = CONCAT44(uStack_e18._4_4_ * uStack_df8._4_4_ +
                                   uStack_1538._4_4_ * uStack_1558._4_4_,
                                   (float)uStack_e18 * (float)uStack_df8 +
                                   (float)uStack_1538 * (float)uStack_1558);
            uStack_2150 = CONCAT44(uStack_e10._4_4_ * uStack_df0._4_4_ +
                                   uStack_1530._4_4_ * uStack_1550._4_4_,
                                   (float)uStack_e10 * (float)uStack_df0 +
                                   (float)uStack_1530 * (float)uStack_1550);
            uStack_2148 = CONCAT44(uStack_e08._4_4_ + uStack_1528._4_4_,
                                   (float)uStack_e08 * (float)uStack_de8 +
                                   (float)uStack_1528 * (float)uStack_1548);
            local_13a8 = local_2098;
            local_13e0 = local_2160;
            uStack_13d8 = uStack_2158;
            uStack_13d0 = uStack_2150;
            uStack_13c8 = uStack_2148;
            *(undefined8 *)*local_2098 = local_2160;
            *(undefined8 *)(*local_2098 + 8) = uStack_2158;
            *(undefined8 *)local_2098[1] = uStack_2150;
            *(undefined8 *)(local_2098[1] + 8) = uStack_2148;
            local_1ff8 = local_1ff8 + 8;
            local_2048 = local_2048 + 8;
            local_2098 = local_2098 + 2;
            local_1560 = local_100._0_8_;
            uStack_1558 = local_100._8_8_;
            uStack_1550 = auStack_f0._0_8_;
            uStack_1548 = auStack_f0._8_8_;
            local_1540 = uVar4;
            uStack_1538 = uVar5;
            uStack_1530 = uVar6;
            uStack_1528 = uVar7;
            local_e20 = local_2180;
            uStack_e18 = uStack_2178;
            uStack_e10 = uStack_2170;
            uStack_e08 = uStack_2168;
            local_e00 = local_c0._0_8_;
            uStack_df8 = local_c0._8_8_;
            uStack_df0 = local_c0._16_8_;
            uStack_de8 = local_c0._24_8_;
          }
          local_2190 = CONCAT44(local_20e4,local_20e4);
          uStack_2188 = CONCAT44(local_20e4,local_20e4);
          local_21a0._8_4_ = local_20e8;
          local_21a0._0_8_ = CONCAT44(local_20e8,local_20e8);
          local_21a0._12_4_ = local_20e8;
          for (; local_20ec + 3 < local_1a8c; local_20ec = local_20ec + 4) {
            local_1268 = local_1ff8;
            uVar4 = *(undefined8 *)local_1ff8;
            uVar5 = *(undefined8 *)(local_1ff8 + 2);
            local_1270 = local_2048;
            uVar6 = *(undefined8 *)local_2048;
            uVar7 = *(undefined8 *)(local_2048 + 2);
            local_11d0._0_4_ = (float)uVar4;
            local_11d0._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_11c8._0_4_ = (float)uVar5;
            uStack_11c8._4_4_ = (float)((ulong)uVar5 >> 0x20);
            local_21b0 = CONCAT44(local_11d0._4_4_ * local_20e4,(float)local_11d0 * local_20e4);
            uStack_21a8 = CONCAT44(uStack_11c8._4_4_ * local_20e4,(float)uStack_11c8 * local_20e4);
            uStack_11f8 = local_21a0._8_8_;
            local_11f0._0_4_ = (float)uVar6;
            local_11f0._4_4_ = (float)((ulong)uVar6 >> 0x20);
            uStack_11e8._0_4_ = (float)uVar7;
            uStack_11e8._4_4_ = (float)((ulong)uVar7 >> 0x20);
            local_21c0 = (float)local_11f0 * local_20e8;
            fStack_21bc = local_11f0._4_4_ * local_20e8;
            fStack_21b8 = (float)uStack_11e8 * local_20e8;
            fStack_21b4 = uStack_11e8._4_4_ * local_20e8;
            local_fd0._4_4_ = fStack_21bc;
            local_fd0._0_4_ = local_21c0;
            local_fd0._8_4_ = fStack_21b8;
            local_fd0._12_4_ = fStack_21b4;
            local_fe0 = local_21b0;
            uStack_fd8 = uStack_21a8;
            local_21b0 = CONCAT44(fStack_21bc + local_11d0._4_4_ * local_20e4,
                                  local_21c0 + (float)local_11d0 * local_20e4);
            uStack_21a8 = CONCAT44(fStack_21b4 + uStack_11c8._4_4_ * local_20e4,
                                   fStack_21b8 + (float)uStack_11c8 * local_20e4);
            local_1108 = local_2098;
            local_1120 = local_21b0;
            uStack_1118 = uStack_21a8;
            auVar19._8_8_ = uStack_21a8;
            auVar19._0_8_ = local_21b0;
            *local_2098 = auVar19;
            local_1ff8 = local_1ff8 + 4;
            local_2048 = local_2048 + 4;
            local_2098 = local_2098 + 1;
            local_1200 = CONCAT44(local_20e8,local_20e8);
            local_11f0 = uVar6;
            uStack_11e8 = uVar7;
            local_11e0 = local_2190;
            uStack_11d8 = uStack_2188;
            local_11d0 = uVar4;
            uStack_11c8 = uVar5;
          }
          for (; local_20ec < local_1a8c; local_20ec = local_20ec + 1) {
            *(float *)*local_2098 = *local_1ff8 * local_20e4 + *local_2048 * local_20e8;
            local_1ff8 = local_1ff8 + 1;
            local_2048 = local_2048 + 1;
            local_2098 = (undefined1 (*) [16])(*local_2098 + 4);
          }
          local_19d8 = local_1fe8;
          local_f48 = local_20e8;
          local_f44 = local_20e4;
          local_d60 = local_20e8;
          fStack_d5c = local_20e8;
          fStack_d58 = local_20e8;
          fStack_d54 = local_20e8;
          local_d44 = local_20e8;
          local_d40 = local_20e4;
          fStack_d3c = local_20e4;
          fStack_d38 = local_20e4;
          fStack_d34 = local_20e4;
          local_d24 = local_20e4;
          local_528 = local_17a0;
          local_508 = local_17b0;
          local_4e8 = local_17c0;
          local_e0 = local_20e4;
          local_dc = local_20e4;
          local_d8 = local_20e4;
          local_d4 = local_20e4;
          local_d0 = local_20e4;
          local_cc = local_20e4;
          local_c8 = local_20e4;
          local_c4 = local_20e4;
          local_c0 = auVar29;
          local_a0 = local_20e8;
          local_9c = local_20e8;
          local_98 = local_20e8;
          local_94 = local_20e8;
          local_90 = local_20e8;
          local_8c = local_20e8;
          local_88 = local_20e8;
          local_84 = local_20e8;
          local_20c0 = local_b60;
          local_2070 = local_8f8;
          local_2020 = local_930;
        }
        for (local_21c8 = 2; uVar25 = local_21c8,
            sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1a60),
            uVar25 < sVar26; local_21c8 = local_21c8 + 1) {
          local_21d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_1a60,local_21c8);
          for (local_21d4 = 0; local_21d4 < local_1a84; local_21d4 = local_21d4 + 1) {
            local_19e8 = &local_2228;
            local_894 = local_21d0->w;
            local_898 = local_21d0->h;
            local_89c = local_21d0->d;
            local_8a8 = (float *)((long)local_21d0->data +
                                 local_21d0->cstep * (long)local_21d4 * local_21d0->elemsize);
            local_8b0 = local_21d0->elemsize;
            local_8b4 = local_21d0->elempack;
            local_8c0 = local_21d0->allocator;
            local_890 = &local_2228;
            local_7a8 = (long)local_894 * (long)local_898 * local_8b0;
            local_1908 = &local_2228;
            local_1790 = &local_2228;
            local_7ac = 0x10;
            local_19f4 = local_21d4;
            local_19f5 = 1;
            local_2228 = 0;
            local_2218 = 0;
            local_2210 = 0;
            local_21fc = 0;
            local_21f8 = 0;
            local_21f4 = 0;
            local_21f0 = 0;
            local_2220 = 0;
            local_16d0 = &local_2278;
            local_afc = local_1a98->w;
            local_b00 = local_1a98->h;
            local_b04 = local_1a98->d;
            local_b10 = (undefined1 (*) [16])
                        ((long)local_1a98->data +
                        local_1a98->cstep * (long)local_21d4 * local_1a98->elemsize);
            local_b18 = local_1a98->elemsize;
            local_b1c = local_1a98->elempack;
            local_b28 = local_1a98->allocator;
            local_af8 = &local_2278;
            local_6f8 = (long)local_afc * (long)local_b00 * local_b18;
            local_6fc = 0x10;
            local_16d8 = local_1a98;
            local_16dc = local_21d4;
            local_16dd = 1;
            local_21e8 = 0;
            local_2200 = 0;
            local_1610 = &local_2278;
            local_1780 = &local_2278;
            local_2278 = 0;
            local_2268 = 0;
            local_2260 = 0;
            local_2250 = 0;
            local_224c = 0;
            local_2248 = 0;
            local_2244 = 0;
            local_2240 = 0;
            local_2238 = 0;
            local_2270 = 0;
            local_f78 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            local_f80 = local_21c8;
            local_227c = *(float *)(*local_f78 + local_21c8 * 4);
            local_2280 = 0;
            auVar2 = vinsertps_avx(ZEXT416((uint)local_227c),ZEXT416((uint)local_227c),0x10);
            auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_227c),0x20);
            auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_227c),0x30);
            auVar1 = vinsertps_avx(ZEXT416((uint)local_227c),ZEXT416((uint)local_227c),0x10);
            auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_227c),0x20);
            auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_227c),0x30);
            auVar30._16_16_ = auVar2;
            auVar30._0_16_ = auVar1;
            local_80._0_8_ = auVar1._0_8_;
            local_80._8_8_ = auVar1._8_8_;
            local_80._16_8_ = auVar2._0_8_;
            local_80._24_8_ = auVar2._8_8_;
            local_22a0 = local_80._0_8_;
            uStack_2298 = local_80._8_8_;
            uStack_2290 = local_80._16_8_;
            uStack_2288 = local_80._24_8_;
            local_2230 = local_b10;
            local_21e0 = local_8a8;
            for (; local_2280 + 7 < local_1a8c; local_2280 = local_2280 + 8) {
              local_15b8 = local_2230;
              local_f40 = *(undefined8 *)*local_2230;
              uStack_f38 = *(undefined8 *)(*local_2230 + 8);
              uStack_f30 = *(undefined8 *)local_2230[1];
              uStack_f28 = *(undefined8 *)(local_2230[1] + 8);
              local_15c0 = local_21e0;
              local_22e0 = *(undefined8 *)local_21e0;
              uStack_22d8 = *(undefined8 *)(local_21e0 + 2);
              uStack_22d0 = *(undefined8 *)(local_21e0 + 4);
              uStack_22c8 = *(undefined8 *)(local_21e0 + 6);
              local_f20 = local_80._0_8_;
              uStack_f18 = local_80._8_8_;
              uStack_f10 = local_80._16_8_;
              uStack_f08 = local_80._24_8_;
              local_f00._0_4_ = (float)local_22e0;
              local_ec0 = (float)local_f00;
              local_f00._4_4_ = (float)((ulong)local_22e0 >> 0x20);
              fStack_ebc = local_f00._4_4_;
              uStack_ef8._0_4_ = (float)uStack_22d8;
              fStack_eb8 = (float)uStack_ef8;
              uStack_ef8._4_4_ = (float)((ulong)uStack_22d8 >> 0x20);
              fStack_eb4 = uStack_ef8._4_4_;
              uStack_ef0._0_4_ = (float)uStack_22d0;
              fStack_eb0 = (float)uStack_ef0;
              uStack_ef0._4_4_ = (float)((ulong)uStack_22d0 >> 0x20);
              fStack_eac = uStack_ef0._4_4_;
              uStack_ee8._0_4_ = (float)uStack_22c8;
              fStack_ea8 = (float)uStack_ee8;
              uStack_ee8._4_4_ = (float)((ulong)uStack_22c8 >> 0x20);
              fStack_ea4 = uStack_ee8._4_4_;
              local_ee0._0_4_ = auVar1._0_4_;
              local_ee0._4_4_ = auVar1._4_4_;
              uStack_ed8._0_4_ = auVar1._8_4_;
              uStack_ed8._4_4_ = auVar1._12_4_;
              uStack_ed0._0_4_ = auVar2._0_4_;
              uStack_ed0._4_4_ = auVar2._4_4_;
              uStack_ec8._0_4_ = auVar2._8_4_;
              local_e80._4_4_ = local_f00._4_4_ * local_ee0._4_4_;
              local_e80._0_4_ = (float)local_f00 * (float)local_ee0;
              local_e80._8_4_ = (float)uStack_ef8 * (float)uStack_ed8;
              local_e80._12_4_ = uStack_ef8._4_4_ * uStack_ed8._4_4_;
              local_e80._16_4_ = (float)uStack_ef0 * (float)uStack_ed0;
              local_e80._20_4_ = uStack_ef0._4_4_ * uStack_ed0._4_4_;
              local_e80._24_4_ = (float)uStack_ee8 * (float)uStack_ec8;
              local_e80._28_4_ = uStack_ee8._4_4_;
              local_ea0._0_4_ = (float)local_f40;
              local_ea0._4_4_ = (float)((ulong)local_f40 >> 0x20);
              uStack_e98._0_4_ = (float)uStack_f38;
              uStack_e98._4_4_ = (float)((ulong)uStack_f38 >> 0x20);
              uStack_e90._0_4_ = (float)uStack_f30;
              uStack_e90._4_4_ = (float)((ulong)uStack_f30 >> 0x20);
              uStack_e88._0_4_ = (float)uStack_f28;
              uStack_e88._4_4_ = (float)((ulong)uStack_f28 >> 0x20);
              local_22c0 = CONCAT44(local_f00._4_4_ * local_ee0._4_4_ + local_ea0._4_4_,
                                    (float)local_f00 * (float)local_ee0 + (float)local_ea0);
              uStack_22b8 = CONCAT44(uStack_ef8._4_4_ * uStack_ed8._4_4_ + uStack_e98._4_4_,
                                     (float)uStack_ef8 * (float)uStack_ed8 + (float)uStack_e98);
              uStack_22b0 = CONCAT44(uStack_ef0._4_4_ * uStack_ed0._4_4_ + uStack_e90._4_4_,
                                     (float)uStack_ef0 * (float)uStack_ed0 + (float)uStack_e90);
              uStack_22a8 = CONCAT44(uStack_ee8._4_4_ + uStack_e88._4_4_,
                                     (float)uStack_ee8 * (float)uStack_ec8 + (float)uStack_e88);
              local_13e8 = local_2230;
              local_1420 = local_22c0;
              uStack_1418 = uStack_22b8;
              uStack_1410 = uStack_22b0;
              uStack_1408 = uStack_22a8;
              *(undefined8 *)*local_2230 = local_22c0;
              *(undefined8 *)(*local_2230 + 8) = uStack_22b8;
              *(undefined8 *)local_2230[1] = uStack_22b0;
              *(undefined8 *)(local_2230[1] + 8) = uStack_22a8;
              local_21e0 = local_21e0 + 8;
              local_2230 = local_2230 + 2;
              local_f00 = local_22e0;
              uStack_ef8 = uStack_22d8;
              uStack_ef0 = uStack_22d0;
              uStack_ee8 = uStack_22c8;
              local_ee0 = local_80._0_8_;
              uStack_ed8 = local_80._8_8_;
              uStack_ed0 = local_80._16_8_;
              uStack_ec8 = local_80._24_8_;
              local_ea0 = local_f40;
              uStack_e98 = uStack_f38;
              uStack_e90 = uStack_f30;
              uStack_e88 = uStack_f28;
            }
            local_22f0._8_4_ = local_227c;
            local_22f0._0_8_ = CONCAT44(local_227c,local_227c);
            local_22f0._12_4_ = local_227c;
            for (; local_2280 + 3 < local_1a8c; local_2280 = local_2280 + 4) {
              local_1278 = local_21e0;
              uVar4 = *(undefined8 *)local_21e0;
              uVar5 = *(undefined8 *)(local_21e0 + 2);
              local_1280 = local_2230;
              uVar6 = *(undefined8 *)*local_2230;
              uVar7 = *(undefined8 *)(*local_2230 + 8);
              uStack_1218 = local_22f0._8_8_;
              local_1210._0_4_ = (float)uVar4;
              local_1210._4_4_ = (float)((ulong)uVar4 >> 0x20);
              uStack_1208._0_4_ = (float)uVar5;
              uStack_1208._4_4_ = (float)((ulong)uVar5 >> 0x20);
              local_2300 = (float)local_1210 * local_227c;
              fStack_22fc = local_1210._4_4_ * local_227c;
              fStack_22f8 = (float)uStack_1208 * local_227c;
              fStack_22f4 = uStack_1208._4_4_ * local_227c;
              local_ff0._4_4_ = fStack_22fc;
              local_ff0._0_4_ = local_2300;
              local_ff0._8_4_ = fStack_22f8;
              local_ff0._12_4_ = fStack_22f4;
              local_1000._0_4_ = (float)uVar6;
              local_1000._4_4_ = (float)((ulong)uVar6 >> 0x20);
              uStack_ff8._0_4_ = (float)uVar7;
              uStack_ff8._4_4_ = (float)((ulong)uVar7 >> 0x20);
              local_2310 = CONCAT44(fStack_22fc + local_1000._4_4_,local_2300 + (float)local_1000);
              uStack_2308 = CONCAT44(fStack_22f4 + uStack_ff8._4_4_,fStack_22f8 + (float)uStack_ff8)
              ;
              local_1128 = local_2230;
              local_1140 = local_2310;
              uStack_1138 = uStack_2308;
              auVar18._8_8_ = uStack_2308;
              auVar18._0_8_ = local_2310;
              *local_2230 = auVar18;
              local_21e0 = local_21e0 + 4;
              local_2230 = local_2230 + 1;
              local_1220 = CONCAT44(local_227c,local_227c);
              local_1210 = uVar4;
              uStack_1208 = uVar5;
              local_1000 = uVar6;
              uStack_ff8 = uVar7;
            }
            for (; local_2280 < local_1a8c; local_2280 = local_2280 + 1) {
              *(float *)*local_2230 = *local_21e0 * local_227c + *(float *)*local_2230;
              local_21e0 = local_21e0 + 1;
              local_2230 = (undefined1 (*) [16])(*local_2230 + 4);
            }
            local_19f0 = local_21d0;
            local_f4c = local_227c;
            local_d80 = local_227c;
            fStack_d7c = local_227c;
            fStack_d78 = local_227c;
            fStack_d74 = local_227c;
            local_d64 = local_227c;
            local_568 = local_1780;
            local_548 = local_1790;
            local_80 = auVar30;
            local_50 = local_227c;
            local_4c = local_227c;
            local_48 = local_227c;
            local_44 = local_227c;
            local_40 = local_227c;
            local_3c = local_227c;
            local_38 = local_227c;
            local_34 = local_227c;
            local_2258 = local_b28;
            local_2208 = local_8c0;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_2318 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a60,1);
      for (local_231c = 0; local_231c < local_1a84; local_231c = local_231c + 1) {
        local_1a00 = &local_2370;
        local_85c = local_1a78->w;
        local_860 = local_1a78->h;
        local_864 = local_1a78->d;
        local_870 = (undefined1 (*) [32])
                    ((long)local_1a78->data +
                    local_1a78->cstep * (long)local_231c * local_1a78->elemsize);
        local_878 = local_1a78->elemsize;
        local_87c = local_1a78->elempack;
        local_888 = local_1a78->allocator;
        local_858 = &local_2370;
        local_7b8 = (long)local_85c * (long)local_860 * local_878;
        local_1910 = &local_2370;
        local_1770 = &local_2370;
        local_1a18 = &local_23c0;
        local_824 = local_2318->w;
        local_828 = local_2318->h;
        local_82c = local_2318->d;
        local_838 = (undefined1 (*) [32])
                    ((long)local_2318->data +
                    local_2318->cstep * (long)local_231c * local_2318->elemsize);
        local_840 = local_2318->elemsize;
        local_844 = local_2318->elempack;
        local_850 = local_2318->allocator;
        local_820 = &local_23c0;
        local_7c8 = (long)local_824 * (long)local_828 * local_840;
        local_1918 = &local_23c0;
        local_1760 = &local_23c0;
        local_16f0 = &local_2410;
        local_ac4 = local_1a98->w;
        local_ac8 = local_1a98->h;
        local_acc = local_1a98->d;
        local_ad8 = (undefined1 (*) [32])
                    ((long)local_1a98->data +
                    local_1a98->cstep * (long)local_231c * local_1a98->elemsize);
        local_ae0 = local_1a98->elemsize;
        local_ae4 = local_1a98->elempack;
        local_af0 = local_1a98->allocator;
        local_ac0 = &local_2410;
        local_708 = (long)local_ac4 * (long)local_ac8 * local_ae0;
        local_1618 = &local_2410;
        local_1750 = &local_2410;
        local_2338 = 0;
        local_233c = 0;
        local_2340 = 0;
        local_2344 = 0;
        local_2358 = 0;
        local_2360 = 0;
        local_2368 = 0;
        local_2370 = 0;
        local_2388 = 0;
        local_238c = 0;
        local_2390 = 0;
        local_2394 = 0;
        local_23a8 = 0;
        local_23b0 = 0;
        local_23b8 = 0;
        local_23c0 = 0;
        local_70c = 0x10;
        local_7bc = 0x10;
        local_7cc = 0x10;
        local_16f8 = local_1a98;
        local_16fc = local_231c;
        local_16fd = 1;
        local_1a08 = local_1a78;
        local_1a0c = local_231c;
        local_1a0d = 1;
        local_1a20 = local_2318;
        local_1a24 = local_231c;
        local_1a25 = 1;
        local_2330 = 0;
        local_2348 = 0;
        local_2380 = 0;
        local_2398 = 0;
        local_2410 = 0;
        local_2400 = 0;
        local_23f8 = 0;
        local_23e8 = 0;
        local_23e4 = 0;
        local_23e0 = 0;
        local_23dc = 0;
        local_23d8 = 0;
        local_23d0 = 0;
        local_2408 = 0;
        local_23c8 = local_ad8;
        local_2378 = local_838;
        local_2328 = local_870;
        for (local_2414 = 0; local_2414 + 7 < local_1a8c; local_2414 = local_2414 + 8) {
          local_15c8 = local_2328;
          auVar24 = *(undefined1 (*) [24])*local_2328;
          uStack_ca8 = *(undefined8 *)(*local_2328 + 0x18);
          local_15d0 = local_2378;
          local_2460 = *(undefined8 *)*local_2378;
          uStack_2458 = *(undefined8 *)(*local_2378 + 8);
          uStack_2450 = *(undefined8 *)(*local_2378 + 0x10);
          uStack_2448 = *(undefined8 *)(*local_2378 + 0x18);
          local_2440._0_8_ = auVar24._0_8_;
          local_cc0 = local_2440._0_8_;
          local_2440._8_8_ = auVar24._8_8_;
          uStack_cb8 = local_2440._8_8_;
          local_2440._16_8_ = auVar24._16_8_;
          uStack_cb0 = local_2440._16_8_;
          local_2440 = vmaxps_avx(*local_2328,*local_2378);
          local_1428 = local_23c8;
          local_1460 = local_2440._0_8_;
          uStack_1458 = local_2440._8_8_;
          uStack_1450 = local_2440._16_8_;
          uStack_1448 = local_2440._24_8_;
          *local_23c8 = local_2440;
          local_2328 = local_2328 + 1;
          local_2378 = local_2378 + 1;
          local_23c8 = local_23c8 + 1;
          local_ce0 = local_2460;
          uStack_cd8 = uStack_2458;
          uStack_cd0 = uStack_2450;
          uStack_cc8 = uStack_2448;
        }
        for (; local_5c8 = local_1750, local_5a8 = local_1760, local_588 = local_1770,
            local_23f0 = local_af0, local_23a0 = local_850, local_2350 = local_888,
            local_2414 + 3 < local_1a8c; local_2414 = local_2414 + 4) {
          local_1288 = local_2328;
          local_c60 = *(undefined8 *)*local_2328;
          uStack_c58 = *(undefined8 *)(*local_2328 + 8);
          local_1290 = local_2378;
          local_2480 = *(undefined8 *)*local_2378;
          uStack_2478 = *(undefined8 *)(*local_2378 + 8);
          local_2470 = vmaxps_avx(*(undefined1 (*) [16])*local_2328,
                                  *(undefined1 (*) [16])*local_2378);
          local_1148 = local_23c8;
          local_1160 = local_2470._0_8_;
          uStack_1158 = local_2470._8_8_;
          *(undefined1 (*) [16])*local_23c8 = local_2470;
          local_2328 = (undefined1 (*) [32])(*local_2328 + 0x10);
          local_2378 = (undefined1 (*) [32])(*local_2378 + 0x10);
          local_23c8 = (undefined1 (*) [32])(*local_23c8 + 0x10);
          local_c70 = local_2480;
          uStack_c68 = uStack_2478;
        }
        for (; local_2414 < local_1a8c; local_2414 = local_2414 + 1) {
          pfVar27 = std::max<float>((float *)local_2328,(float *)local_2378);
          *(float *)*local_23c8 = *pfVar27;
          local_2328 = (undefined1 (*) [32])(*local_2328 + 4);
          local_2378 = (undefined1 (*) [32])(*local_2378 + 4);
          local_23c8 = (undefined1 (*) [32])(*local_23c8 + 4);
        }
      }
      for (local_2488 = 2; uVar25 = local_2488,
          sVar26 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1a60),
          uVar25 < sVar26; local_2488 = local_2488 + 1) {
        local_2490 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_1a60,local_2488);
        for (local_2494 = 0; local_2494 < local_1a84; local_2494 = local_2494 + 1) {
          local_1a30 = &local_24e8;
          local_7ec = local_2490->w;
          local_7f0 = local_2490->h;
          local_7f4 = local_2490->d;
          local_800 = (undefined1 (*) [32])
                      ((long)local_2490->data +
                      local_2490->cstep * (long)local_2494 * local_2490->elemsize);
          local_808 = local_2490->elemsize;
          local_80c = local_2490->elempack;
          local_818 = local_2490->allocator;
          local_7e8 = &local_24e8;
          local_7d8 = (long)local_7ec * (long)local_7f0 * local_808;
          local_1920 = &local_24e8;
          local_1740 = &local_24e8;
          local_1710 = &local_2538;
          local_a8c = local_1a98->w;
          local_a90 = local_1a98->h;
          local_a94 = local_1a98->d;
          local_aa0 = (undefined1 (*) [32])
                      ((long)local_1a98->data +
                      local_1a98->cstep * (long)local_2494 * local_1a98->elemsize);
          local_aa8 = local_1a98->elemsize;
          local_aac = local_1a98->elempack;
          local_ab8 = local_1a98->allocator;
          local_a88 = &local_2538;
          local_718 = (long)local_a8c * (long)local_a90 * local_aa8;
          local_1620 = &local_2538;
          local_1730 = &local_2538;
          local_24b0 = 0;
          local_24b4 = 0;
          local_24b8 = 0;
          local_24bc = 0;
          local_24d0 = 0;
          local_24d8 = 0;
          local_24e0 = 0;
          local_24e8 = 0;
          local_71c = 0x10;
          local_7dc = 0x10;
          local_1718 = local_1a98;
          local_171c = local_2494;
          local_171d = 1;
          local_1a38 = local_2490;
          local_1a3c = local_2494;
          local_1a3d = 1;
          local_24a8 = 0;
          local_24c0 = 0;
          local_2538 = 0;
          local_2528 = 0;
          local_2520 = 0;
          local_2510 = 0;
          local_250c = 0;
          local_2508 = 0;
          local_2504 = 0;
          local_2500 = 0;
          local_24f8 = 0;
          local_2530 = 0;
          local_24f0 = local_aa0;
          local_24a0 = local_800;
          for (local_253c = 0; local_253c + 7 < local_1a8c; local_253c = local_253c + 8) {
            local_15d8 = local_24f0;
            auVar24 = *(undefined1 (*) [24])*local_24f0;
            uStack_ce8 = *(undefined8 *)(*local_24f0 + 0x18);
            local_15e0 = local_24a0;
            local_d20 = *(undefined8 *)*local_24a0;
            uStack_d18 = *(undefined8 *)(*local_24a0 + 8);
            uStack_d10 = *(undefined8 *)(*local_24a0 + 0x10);
            uStack_d08 = *(undefined8 *)(*local_24a0 + 0x18);
            local_2560 = auVar24._0_8_;
            local_d00 = local_2560;
            uStack_2558 = auVar24._8_8_;
            uStack_cf8 = uStack_2558;
            uStack_2550 = auVar24._16_8_;
            uStack_cf0 = uStack_2550;
            auVar3 = vmaxps_avx(*local_24f0,*local_24a0);
            local_1468 = local_24f0;
            local_2560 = auVar3._0_8_;
            local_14a0 = local_2560;
            uStack_2558 = auVar3._8_8_;
            uStack_1498 = uStack_2558;
            uStack_2550 = auVar3._16_8_;
            uStack_1490 = uStack_2550;
            uStack_2548 = auVar3._24_8_;
            uStack_1488 = uStack_2548;
            *local_24f0 = auVar3;
            local_24a0 = local_24a0 + 1;
            local_24f0 = local_24f0 + 1;
          }
          for (; local_608 = local_1730, local_5e8 = local_1740, local_2518 = local_ab8,
              local_24c8 = local_818, local_253c + 3 < local_1a8c; local_253c = local_253c + 4) {
            local_1298 = local_24f0;
            local_c80 = *(undefined8 *)*local_24f0;
            uStack_c78 = *(undefined8 *)(*local_24f0 + 8);
            local_12a0 = local_24a0;
            local_c90 = *(undefined8 *)*local_24a0;
            uStack_c88 = *(undefined8 *)(*local_24a0 + 8);
            auVar2 = vmaxps_avx(*(undefined1 (*) [16])*local_24f0,*(undefined1 (*) [16])*local_24a0)
            ;
            local_1168 = local_24f0;
            local_2590 = auVar2._0_8_;
            local_1180 = local_2590;
            uStack_2588 = auVar2._8_8_;
            uStack_1178 = uStack_2588;
            *(undefined1 (*) [16])*local_24f0 = auVar2;
            local_24a0 = (undefined1 (*) [32])(*local_24a0 + 0x10);
            local_24f0 = (undefined1 (*) [32])(*local_24f0 + 0x10);
          }
          for (; local_253c < local_1a8c; local_253c = local_253c + 1) {
            pfVar27 = std::max<float>((float *)local_24a0,(float *)local_24f0);
            *(float *)*local_24f0 = *pfVar27;
            local_24a0 = (undefined1 (*) [32])(*local_24a0 + 4);
            local_24f0 = (undefined1 (*) [32])(*local_24f0 + 4);
          }
        }
      }
    }
    local_1a4c = 0;
  }
  return local_1a4c;
}

Assistant:

int Eltwise_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}